

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O2

void __thiscall
vkt::QueryPool::anon_unknown_0::BasicOcclusionQueryTestInstance::~BasicOcclusionQueryTestInstance
          (BasicOcclusionQueryTestInstance *this)

{
  StateObjects *this_00;
  VkDevice pVVar1;
  DeviceInterface *pDVar2;
  
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__BasicOcclusionQueryTestInstance_00bd6b28;
  this_00 = this->m_stateObjects;
  if (this_00 != (StateObjects *)0x0) {
    StateObjects::~StateObjects(this_00);
    operator_delete(this_00,0x100);
  }
  if ((this->m_queryPool).m_internal != 0) {
    pVVar1 = Context::getDevice((this->super_TestInstance).m_context);
    pDVar2 = Context::getDeviceInterface((this->super_TestInstance).m_context);
    (*pDVar2->_vptr_DeviceInterface[0x1f])(pDVar2,pVVar1,(this->m_queryPool).m_internal,0);
  }
  return;
}

Assistant:

BasicOcclusionQueryTestInstance::~BasicOcclusionQueryTestInstance (void)
{
	if (m_stateObjects)
		delete m_stateObjects;

	if (m_queryPool != DE_NULL)
	{
		const vk::VkDevice device		= m_context.getDevice();
		const vk::DeviceInterface& vk	= m_context.getDeviceInterface();

		vk.destroyQueryPool(device, m_queryPool, /*pAllocator*/ DE_NULL);
	}
}